

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu.cpp
# Opt level: O0

int __thiscall ncnn::ELU::forward_inplace(ELU *this,Mat *bottom_top_blob)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float in_stack_ffffffffffffff74;
  Mat *this_00;
  int local_70;
  Mat local_60;
  float *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 0x1c);
  local_18 = *(int *)(in_RSI + 0x20);
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = local_14 * local_18;
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    this_00 = &local_60;
    Mat::channel(this_00,(int)in_stack_ffffffffffffff74);
    pfVar1 = Mat::operator_cast_to_float_(this_00);
    Mat::~Mat((Mat *)0x1184f6);
    local_30 = pfVar1;
    for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
      if (local_30[local_70] <= 0.0 && local_30[local_70] != 0.0) {
        in_stack_ffffffffffffff74 = *(float *)(in_RDI + 0x80);
        dVar2 = std::exp((double)(ulong)(uint)local_30[local_70]);
        local_30[local_70] = in_stack_ffffffffffffff74 * (SUB84(dVar2,0) - 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int ELU::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = alpha * (exp(ptr[i]) - 1.f);
        }
    }

    return 0;
}